

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::RequiredError::RequiredError(RequiredError *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ExitCodes in_stack_00000024;
  string *in_stack_00000028;
  RequiredError *in_stack_00000030;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  ::std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  RequiredError(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

explicit RequiredError(std::string name) : RequiredError(name + " is required", ExitCodes::RequiredError) {}